

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O0

Terminal * term_init(Conf *myconf,unicode_data *ucsdata,TermWin *win)

{
  undefined4 uVar1;
  Terminal *term_00;
  Conf *pCVar2;
  char *pcVar3;
  BidiContext *pBVar4;
  Terminal *term;
  TermWin *win_local;
  unicode_data *ucsdata_local;
  Conf *myconf_local;
  
  term_00 = (Terminal *)safemalloc(1,0x2200,0);
  term_00->win = win;
  term_00->ucsdata = ucsdata;
  pCVar2 = conf_copy(myconf);
  term_00->conf = pCVar2;
  term_00->logctx = (LogContext *)0x0;
  term_00->compatibility_level = L'\xffff';
  strcpy(term_00->id_string,"\x1b[?6c");
  term_00->tblink_pending = false;
  term_00->cblink_pending = false;
  term_00->paste_buffer = (wchar_t *)0x0;
  term_00->paste_len = L'\0';
  bufchain_init(&term_00->inbuf);
  bufchain_init(&term_00->printer_buf);
  term_00->only_printing = false;
  term_00->printing = false;
  term_00->print_job = (printer_job *)0x0;
  term_00->vt52_mode = false;
  term_00->cr_lf_return = false;
  term_00->seen_disp_event = false;
  term_00->mouse_is_down = L'\0';
  term_00->reset_132 = false;
  term_00->cblinker = false;
  term_00->tblinker = false;
  term_00->has_focus = true;
  term_00->repeat_off = false;
  term_00->termstate = LEXICOGRAPHIC;
  term_00->selstate = LEXICOGRAPHIC;
  term_00->curstype = L'\0';
  term_copy_stuff_from_conf(term_00);
  term_00->scrollback = (tree234 *)0x0;
  term_00->alt_screen = (tree234 *)0x0;
  term_00->screen = (tree234 *)0x0;
  term_00->tempsblines = L'\0';
  term_00->alt_sblines = L'\0';
  term_00->disptop = L'\0';
  term_00->disptext = (termline **)0x0;
  term_00->dispcursy = L'\xffffffff';
  term_00->dispcursx = L'\xffffffff';
  term_00->tabs = (uchar *)0x0;
  deselect(term_00);
  term_00->cols = L'\xffffffff';
  term_00->rows = L'\xffffffff';
  power_on(term_00,true);
  term_00->beeptail = (beeptime *)0x0;
  term_00->beephead = (beeptime *)0x0;
  term_00->nbeeps = L'\0';
  term_00->lastbeep = 0;
  term_00->beep_overloaded = false;
  term_00->attr_mask = L'\xffffffff';
  term_00->backend = (Backend *)0x0;
  term_00->in_term_out = false;
  term_00->ltemp = (termchar *)0x0;
  term_00->ltemp_size = L'\0';
  term_00->wcFrom = (bidi_char *)0x0;
  term_00->wcTo = (bidi_char *)0x0;
  term_00->wcFromTo_size = L'\0';
  term_00->window_update_pending = false;
  term_00->window_update_cooldown = false;
  term_00->bidi_cache_size = 0;
  term_00->post_bidi_cache = (bidi_cache_entry *)0x0;
  term_00->pre_bidi_cache = (bidi_cache_entry *)0x0;
  (term_00->basic_erase_char).chr = 0xd820;
  (term_00->basic_erase_char).attr = 0x20500;
  (term_00->basic_erase_char).cc_next = L'\0';
  (term_00->basic_erase_char).truecolour.fg.enabled = false;
  (term_00->basic_erase_char).truecolour.fg.r = '\0';
  (term_00->basic_erase_char).truecolour.fg.g = '\0';
  (term_00->basic_erase_char).truecolour.fg.b = '\0';
  (term_00->basic_erase_char).truecolour.bg.enabled = false;
  (term_00->basic_erase_char).truecolour.bg.r = '\0';
  (term_00->basic_erase_char).truecolour.bg.g = '\0';
  (term_00->basic_erase_char).truecolour.bg.b = '\0';
  (term_00->erase_char).chr = (term_00->basic_erase_char).chr;
  (term_00->erase_char).attr = (term_00->basic_erase_char).attr;
  (term_00->erase_char).truecolour = (term_00->basic_erase_char).truecolour;
  uVar1 = *(undefined4 *)&(term_00->basic_erase_char).field_0x1c;
  (term_00->erase_char).cc_next = (term_00->basic_erase_char).cc_next;
  *(undefined4 *)&(term_00->erase_char).field_0x1c = uVar1;
  term_00->last_selected_text = (wchar_t *)0x0;
  term_00->last_selected_attr = (wchar_t *)0x0;
  term_00->last_selected_tc = (truecolour *)0x0;
  term_00->last_selected_len = 0;
  term_00->mouse_select_clipboards[0] = L'\x01';
  term_00->n_mouse_select_clipboards = L'\x01';
  term_00->mouse_paste_clipboard = L'\0';
  term_00->last_graphic_char = 0;
  term_00->trusted = true;
  term_00->bracketed_paste_active = false;
  pcVar3 = dupstr("");
  term_00->window_title = pcVar3;
  pcVar3 = dupstr("");
  term_00->icon_title = pcVar3;
  term_00->icontitle_codepage = L'\xffff';
  term_00->wintitle_codepage = L'\xffff';
  term_00->minimised = false;
  term_00->winpos_y = 0;
  term_00->winpos_x = 0;
  term_00->winpixsize_y = 0;
  term_00->winpixsize_x = 0;
  term_00->win_move_pending = false;
  term_00->win_resize_pending = LEXICOGRAPHIC;
  term_00->win_zorder_pending = false;
  term_00->win_minimise_pending = false;
  term_00->win_maximise_pending = false;
  term_00->win_title_pending = false;
  term_00->win_icon_title_pending = false;
  term_00->win_pointer_shape_pending = false;
  term_00->win_refresh_pending = false;
  term_00->win_scrollbar_update_pending = false;
  term_00->win_palette_pending = false;
  pBVar4 = bidi_new_context();
  term_00->bidi_ctx = pBVar4;
  palette_reset(term_00,false);
  return term_00;
}

Assistant:

Terminal *term_init(Conf *myconf, struct unicode_data *ucsdata, TermWin *win)
{
    Terminal *term;

    /*
     * Allocate a new Terminal structure and initialise the fields
     * that need it.
     */
    term = snew(Terminal);
    term->win = win;
    term->ucsdata = ucsdata;
    term->conf = conf_copy(myconf);
    term->logctx = NULL;
    term->compatibility_level = TM_PUTTY;
    strcpy(term->id_string, "\033[?6c");
    term->cblink_pending = term->tblink_pending = false;
    term->paste_buffer = NULL;
    term->paste_len = 0;
    bufchain_init(&term->inbuf);
    bufchain_init(&term->printer_buf);
    term->printing = term->only_printing = false;
    term->print_job = NULL;
    term->vt52_mode = false;
    term->cr_lf_return = false;
    term->seen_disp_event = false;
    term->mouse_is_down = 0;
    term->reset_132 = false;
    term->cblinker = false;
    term->tblinker = false;
    term->has_focus = true;
    term->repeat_off = false;
    term->termstate = TOPLEVEL;
    term->selstate = NO_SELECTION;
    term->curstype = 0;

    term_copy_stuff_from_conf(term);

    term->screen = term->alt_screen = term->scrollback = NULL;
    term->tempsblines = 0;
    term->alt_sblines = 0;
    term->disptop = 0;
    term->disptext = NULL;
    term->dispcursx = term->dispcursy = -1;
    term->tabs = NULL;
    deselect(term);
    term->rows = term->cols = -1;
    power_on(term, true);
    term->beephead = term->beeptail = NULL;
    term->nbeeps = 0;
    term->lastbeep = false;
    term->beep_overloaded = false;
    term->attr_mask = 0xffffffff;
    term->backend = NULL;
    term->in_term_out = false;
    term->ltemp = NULL;
    term->ltemp_size = 0;
    term->wcFrom = NULL;
    term->wcTo = NULL;
    term->wcFromTo_size = 0;

    term->window_update_pending = false;
    term->window_update_cooldown = false;

    term->bidi_cache_size = 0;
    term->pre_bidi_cache = term->post_bidi_cache = NULL;

    /* FULL-TERMCHAR */
    term->basic_erase_char.chr = CSET_ASCII | ' ';
    term->basic_erase_char.attr = ATTR_DEFAULT;
    term->basic_erase_char.cc_next = 0;
    term->basic_erase_char.truecolour.fg = optionalrgb_none;
    term->basic_erase_char.truecolour.bg = optionalrgb_none;
    term->erase_char = term->basic_erase_char;

    term->last_selected_text = NULL;
    term->last_selected_attr = NULL;
    term->last_selected_tc = NULL;
    term->last_selected_len = 0;
    /* TermWin implementations will typically extend these with
     * clipboard ids they know about */
    term->mouse_select_clipboards[0] = CLIP_LOCAL;
    term->n_mouse_select_clipboards = 1;
    term->mouse_paste_clipboard = CLIP_NULL;

    term->last_graphic_char = 0;

    term->trusted = true;

    term->bracketed_paste_active = false;

    term->window_title = dupstr("");
    term->icon_title = dupstr("");
    term->wintitle_codepage = term->icontitle_codepage = DEFAULT_CODEPAGE;
    term->minimised = false;
    term->winpos_x = term->winpos_y = 0;
    term->winpixsize_x = term->winpixsize_y = 0;

    term->win_move_pending = false;
    term->win_resize_pending = WIN_RESIZE_NO;
    term->win_zorder_pending = false;
    term->win_minimise_pending = false;
    term->win_maximise_pending = false;
    term->win_title_pending = false;
    term->win_icon_title_pending = false;
    term->win_pointer_shape_pending = false;
    term->win_refresh_pending = false;
    term->win_scrollbar_update_pending = false;
    term->win_palette_pending = false;

    term->bidi_ctx = bidi_new_context();

    palette_reset(term, false);

    return term;
}